

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanDirective(Scanner *this)

{
  iterator pcVar1;
  int *piVar2;
  ilist_node_base<false> *piVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  ilist_node_base<false> *piVar7;
  undefined4 uVar8;
  int *piVar9;
  bool bVar10;
  Token T;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_40 [16];
  
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  pcVar1 = this->Current;
  consume(this,0x25);
  piVar6 = (int *)this->Current;
  piVar2 = (int *)this->End;
  piVar9 = piVar6;
  do {
    piVar4 = piVar9;
    if (((piVar2 == piVar9) || ((char)*piVar9 == '\t')) || ((char)*piVar9 == ' ')) break;
    piVar4 = (int *)skip_nb_char(this,(iterator)piVar9);
    bVar10 = piVar4 != piVar9;
    piVar9 = piVar4;
  } while (bVar10);
  this->Current = (iterator)piVar4;
  lVar5 = (long)piVar4 - (long)piVar6;
  piVar9 = piVar4;
  for (; (piVar2 != piVar4 && (((char)*piVar4 == ' ' || (piVar9 = piVar4, (char)*piVar4 == '\t'))));
      piVar4 = (int *)((long)piVar4 + 1)) {
    piVar9 = piVar2;
  }
  this->Current = (iterator)piVar9;
  local_40[0] = 0;
  if (lVar5 == 3) {
    if (*(char *)((long)piVar6 + 2) != 'G' || (short)*piVar6 != 0x4154) {
      return false;
    }
    while ((piVar2 != piVar9 && ((char)*piVar9 != '\t'))) {
      if (((char)*piVar9 == ' ') ||
         (piVar6 = (int *)skip_nb_char(this,(iterator)piVar9), bVar10 = piVar6 == piVar9,
         piVar9 = piVar6, bVar10)) break;
    }
    this->Current = (iterator)piVar9;
    piVar6 = piVar9;
    for (; (piVar2 != piVar9 && (((char)*piVar9 == ' ' || (piVar6 = piVar9, (char)*piVar9 == '\t')))
           ); piVar9 = (int *)((long)piVar9 + 1)) {
      piVar6 = piVar2;
    }
    this->Current = (iterator)piVar6;
    uVar8 = 4;
    do {
      if (((piVar2 == piVar6) || ((char)*piVar6 == '\t')) || ((char)*piVar6 == ' ')) break;
      piVar9 = (int *)skip_nb_char(this,(iterator)piVar6);
      bVar10 = piVar9 != piVar6;
      piVar6 = piVar9;
    } while (bVar10);
  }
  else {
    if ((lVar5 != 4) || (*piVar6 != 0x4c4d4159)) {
      return false;
    }
    uVar8 = 3;
    while ((piVar6 = piVar9, piVar2 != piVar9 && ((char)*piVar9 != '\t'))) {
      if (((char)*piVar9 == ' ') ||
         (piVar6 = (int *)skip_nb_char(this,(iterator)piVar9), bVar10 = piVar6 == piVar9,
         piVar9 = piVar6, bVar10)) break;
    }
  }
  this->Current = (iterator)piVar6;
  piVar7 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,0x10);
  piVar7->Prev = (ilist_node_base<false> *)0x0;
  piVar7->Next = (ilist_node_base<false> *)0x0;
  uStack_60 = SUB84(pcVar1,0);
  uStack_5c = (undefined4)((ulong)pcVar1 >> 0x20);
  *(undefined4 *)&piVar7[1].Prev = uVar8;
  *(undefined4 *)((long)&piVar7[1].Prev + 4) = uStack_64;
  *(undefined4 *)&piVar7[1].Next = uStack_60;
  *(undefined4 *)((long)&piVar7[1].Next + 4) = uStack_5c;
  piVar7[2].Prev = (ilist_node_base<false> *)((long)piVar6 - (long)pcVar1);
  piVar7[2].Next = (ilist_node_base<false> *)&piVar7[3].Next;
  std::__cxx11::string::_M_construct<char*>((string *)&piVar7[2].Next,local_40,local_40);
  piVar3 = (this->TokenQueue).List.Sentinel.
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar7->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
  piVar7->Prev = piVar3;
  piVar3->Next = piVar7;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar7;
  return true;
}

Assistant:

bool Scanner::scanDirective() {
  // Reset the indentation level.
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  StringRef::iterator Start = Current;
  consume('%');
  StringRef::iterator NameStart = Current;
  Current = skip_while(&Scanner::skip_ns_char, Current);
  StringRef Name(NameStart, Current - NameStart);
  Current = skip_while(&Scanner::skip_s_white, Current);

  Token T;
  if (Name == "YAML") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_VersionDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  } else if(Name == "TAG") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    Current = skip_while(&Scanner::skip_s_white, Current);
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_TagDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  }
  return false;
}